

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wmb.cpp
# Opt level: O0

factor * __thiscall merlin::wmb::incoming(factor *__return_storage_ptr__,wmb *this,findex a)

{
  bool bVar1;
  reference pvVar2;
  reference B;
  reference pvVar3;
  reference puVar4;
  reference this_00;
  reference pvVar5;
  size_t j;
  findex p;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_30;
  const_iterator ci;
  findex a_local;
  wmb *this_local;
  factor *bel;
  
  ci._M_current._7_1_ = 0;
  pvVar2 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                     (&(this->super_graphical_model).m_factors,a);
  B = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[](&this->m_reparam,a);
  factor::operator*(__return_storage_ptr__,pvVar2,B);
  pvVar3 = std::
           vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
           operator[](&this->m_in,a);
  local_30._M_current = (unsigned_long *)my_set<unsigned_long>::begin(pvVar3);
  while( true ) {
    pvVar3 = std::
             vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
             ::operator[](&this->m_in,a);
    p = (findex)my_set<unsigned_long>::end(pvVar3);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)&p);
    if (!bVar1) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_30);
    this_00 = std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::operator[](&this->m_edge_indeces,*puVar4);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this_00,a);
    pvVar2 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                       (&this->m_forward,*pvVar5);
    factor::operator*=(__return_storage_ptr__,pvVar2);
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

factor wmb::incoming(findex a) {

	factor bel = m_factors[a] * m_reparam[a];

	// forward messages to 'a'
	for (flist::const_iterator ci = m_in[a].begin();
			ci != m_in[a].end(); ++ci) {
		findex p = (*ci);
		size_t j = m_edge_indeces[p][a];
		bel *= m_forward[j];
	}

	return bel;
}